

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

uint16_t * __thiscall
anon_unknown.dwarf_1c1499d::
AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
::RandomInput16(AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                *this,uint16_t *p,
               TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
               *param)

{
  int iVar1;
  undefined8 *puVar2;
  size_type sVar3;
  uint uVar4;
  uint32_t uVar5;
  SEARCH_METHODS *pSVar6;
  char *in_R9;
  long lVar7;
  ulong uVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  Message local_68;
  undefined8 *local_60;
  AssertHelper local_58;
  string local_50;
  
  iVar1 = param->bd_;
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_68.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,iVar1 == 0xc || iVar1 == 10);
  local_60 = (undefined8 *)0x0;
  if ((iVar1 != 10) && (iVar1 != 0xc)) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_68,
               (AssertionResult *)"param.BitDepth() == 10 || param.BitDepth() == 12","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
               ,0x120,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       (char)local_50._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
    }
    if ((long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) + 8))();
    }
  }
  puVar2 = local_60;
  if (local_60 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_60 != local_60 + 2) {
      operator_delete((undefined8 *)*local_60);
    }
    operator_delete(puVar2);
  }
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x80;
  local_70.data_._0_4_ = (param->block_).width_;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&local_50,"(1 << 7)","param.Block().Width()",(int *)&local_68,
             (int *)&local_70);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_68);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
               ,0x121,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  sVar3 = local_50._M_string_length;
  if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_50._M_string_length !=
        (undefined8 *)(local_50._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_50._M_string_length);
    }
    operator_delete((void *)sVar3);
  }
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x80;
  local_70.data_._0_4_ = (param->block_).height_;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&local_50,"(1 << 7)","param.Block().Height()",(int *)&local_68,
             (int *)&local_70);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_68);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
               ,0x122,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_50._M_string_length !=
        (undefined8 *)(local_50._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_50._M_string_length);
    }
    operator_delete((void *)local_50._M_string_length);
  }
  lVar7 = (long)(param->block_).width_ + 0xc;
  uVar4 = ((param->block_).height_ + 0xc) * (int)lVar7;
  if (0 < (int)uVar4) {
    iVar1 = param->bd_;
    uVar8 = 0;
    do {
      uVar5 = testing::internal::Random::Generate(&(this->rnd_).random_,0x80000000);
      p[uVar8] = (ushort)(uVar5 >> 0xf) & ~(ushort)(-1 << ((byte)iVar1 & 0x1f));
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  return p + lVar7 * 6 + 6;
}

Assistant:

const uint16_t *RandomInput16(uint16_t *p, const TestParam<T> &param) {
    // Check that this is only called with high bit-depths.
    EXPECT_TRUE(param.BitDepth() == 10 || param.BitDepth() == 12);
    EXPECT_GE(MAX_SB_SIZE, param.Block().Width());
    EXPECT_GE(MAX_SB_SIZE, param.Block().Height());
    const int padded_width = param.Block().Width() + kInputPadding;
    const int padded_height = param.Block().Height() + kInputPadding;
    Randomize(p, padded_width * padded_height, param.BitDepth());
    return p + (kInputPadding / 2) * padded_width + kInputPadding / 2;
  }